

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::absI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  Literal *in_RDX;
  long lVar1;
  Literal *this_01;
  undefined1 local_100 [8];
  LaneArray<8> lanes;
  
  getLanes<short,8>((LaneArray<8> *)local_100,(wasm *)this,in_RDX);
  this_00 = &lanes._M_elems[7].type;
  for (lVar1 = 0; lVar1 != 0xc0; lVar1 = lVar1 + 0x18) {
    this_01 = (Literal *)(local_100 + lVar1);
    abs((Literal *)this_00,(int)this_01);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
  }
  Literal(__return_storage_ptr__,(LaneArray<8> *)local_100);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_100);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::absI16x8() const {
  return unary<8, &Literal::getLanesSI16x8, &Literal::abs>(*this);
}